

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<float>::make_l1_norm(quadratic_cost_type<float> *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  quad *pqVar3;
  undefined1 auVar4 [16];
  int i_1;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  
  auVar8._8_4_ = 0x7fffffff;
  auVar8._0_8_ = 0x7fffffff7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  pfVar2 = (this->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
           _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
           super__Head_base<0UL,_float_*,_false>._M_head_impl;
  fVar7 = 0.0;
  uVar5 = 0;
  while ((uint)n != uVar5) {
    pfVar1 = pfVar2 + uVar5;
    uVar5 = uVar5 + 1;
    auVar4 = vandps_avx(ZEXT416((uint)*pfVar1),auVar8);
    fVar7 = fVar7 + auVar4._0_4_;
  }
  uVar5 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  uVar6 = 0;
  while (uVar5 != uVar6) {
    pqVar3 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
             _M_head_impl + uVar6;
    uVar6 = uVar6 + 1;
    auVar4 = vandps_avx(ZEXT416((uint)pqVar3->factor),auVar8);
    fVar7 = fVar7 + auVar4._0_4_;
  }
  if ((int)ABS(fVar7) - 0x800000U < 0x7f000000) {
    for (uVar6 = 0; (uint)n != uVar6; uVar6 = uVar6 + 1) {
      pfVar2[uVar6] = pfVar2[uVar6] / fVar7;
    }
    pqVar3 = (this->quadratic_elements)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
             .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
             _M_head_impl;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      pqVar3[uVar6].factor = pqVar3[uVar6].factor / fVar7;
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        for (int i = 0, e = indices[n]; i != e; ++i)
            div += std::abs(quadratic_elements[i].factor);

        if (std::isnormal(div)) {
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;

            for (int i = 0, e = indices[n]; i != e; ++i)
                quadratic_elements[i].factor /= div;
        }
    }